

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_nl.h
# Opt level: O2

void __thiscall
mp::NLConstraint::NLConstraint(NLConstraint *this,LinTerms *lt,int expr,AlgConRange rng,bool fSort)

{
  LinTerms local_90;
  
  (this->super_BasicConstraint).name_._M_dataplus._M_p =
       (pointer)&(this->super_BasicConstraint).name_.field_2;
  (this->super_BasicConstraint).name_._M_string_length = 0;
  (this->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  LinTerms::LinTerms(&local_90,lt);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
            (&this->lcr_,&local_90,rng,fSort);
  LinTerms::~LinTerms(&local_90);
  this->expr_ = expr;
  return;
}

Assistant:

NLConstraint(
      const LinTerms& lt, int expr, AlgConRange rng,
      bool fSort=true)
      : lcr_(lt, rng, fSort), expr_(expr) { }